

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O2

int mbedtls_mpi_core_read_be(mbedtls_mpi_uint *X,size_t X_limbs,uchar *input,size_t input_length)

{
  int iVar1;
  
  if (X_limbs < ((input_length >> 3) + 1) - (ulong)((input_length & 7) == 0)) {
    iVar1 = -8;
  }
  else if (X_limbs == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    memset(X,0,X_limbs * 8);
    if (input_length != 0) {
      memcpy((void *)((X_limbs * 8 - input_length) + (long)X),input,input_length);
    }
    mbedtls_mpi_core_bigendian_to_host(X,X_limbs);
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_core_read_be(mbedtls_mpi_uint *X,
                             size_t X_limbs,
                             const unsigned char *input,
                             size_t input_length)
{
    const size_t limbs = CHARS_TO_LIMBS(input_length);

    if (X_limbs < limbs) {
        return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
    }

    /* If X_limbs is 0, input_length must also be 0 (from previous test).
     * Nothing to do. */
    if (X_limbs == 0) {
        return 0;
    }

    memset(X, 0, X_limbs * ciL);

    /* memcpy() with (NULL, 0) is undefined behaviour */
    if (input_length != 0) {
        size_t overhead = (X_limbs * ciL) - input_length;
        unsigned char *Xp = (unsigned char *) X;
        memcpy(Xp + overhead, input, input_length);
    }

    mbedtls_mpi_core_bigendian_to_host(X, X_limbs);

    return 0;
}